

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

natwm_error client_set_fullscreen(natwm_state *state,client *client)

{
  natwm_error nVar1;
  workspace *workspace;
  monitor *pmVar2;
  
  workspace = workspace_list_find_client_workspace(state->workspace_list,client);
  pmVar2 = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
  if (pmVar2 == (monitor *)0x0) {
    nVar1 = RESOLUTION_FAILURE;
  }
  else {
    client->is_fullscreen = true;
    ewmh_add_window_state(state,client->window,state->ewmh->_NET_WM_STATE_FULLSCREEN);
    client_configure_window_rect(state->xcb,client->window,pmVar2->rect,0);
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error client_set_fullscreen(const struct natwm_state *state, struct client *client)
{
        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);
        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        client->is_fullscreen = true;

        ewmh_add_window_state(state, client->window, state->ewmh->_NET_WM_STATE_FULLSCREEN);

        client_configure_window_rect(state->xcb, client->window, monitor->rect, 0);

        return NO_ERROR;
}